

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

LY_ERR lyd_dup_r(lyd_node *node,ly_ctx *trg_ctx,lyd_node *parent,uint32_t insert_order,
                lyd_node **first,uint32_t options,lyd_node **dup_p)

{
  lysc_node **trg_schema;
  ly_ctx **pplVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint uVar4;
  LY_VALUE_FORMAT LVar5;
  lyd_meta *meta;
  long lVar6;
  lyd_attr *plVar7;
  lysc_node *type;
  uint uVar8;
  LY_ERR LVar9;
  lyd_node_opaq *parent_00;
  lyd_attr *attr;
  lys_module *plVar10;
  lyd_attr *plVar11;
  char *pcVar12;
  size_t value_len;
  ly_ht *plVar13;
  lysc_node *plVar14;
  lyd_meta **pplVar15;
  lyd_node *plVar16;
  size_t sStack_60;
  
  uVar4 = node->flags;
  if ((uVar4 & 8) == 0) {
    plVar14 = node->schema;
  }
  else {
    if ((options & 0x10) != 0) {
      return LY_SUCCESS;
    }
    plVar14 = node->schema;
    if (plVar14 == (lysc_node *)0x0) {
      plVar10 = (lys_module *)&node[2].schema;
    }
    else {
      plVar10 = plVar14->module;
    }
    trg_ctx = plVar10->ctx;
  }
  if (plVar14 == (lysc_node *)0x0) {
    parent_00 = (lyd_node_opaq *)calloc(1,0x80);
    parent_00->ctx = trg_ctx;
  }
  else {
    uVar2 = plVar14->nodetype;
    if (uVar2 == 1) {
LAB_00124511:
      sStack_60 = 0x48;
    }
    else {
      if ((uVar2 != 4) && (uVar2 != 8)) {
        if ((((uVar2 != 0x10) && (uVar2 != 0x20)) && (uVar2 != 0x60)) &&
           (((uVar2 != 0x100 && (uVar2 != 0x400)) && (uVar2 != 0x200)))) {
          parent_00 = (lyd_node_opaq *)0x0;
          LVar9 = LY_EINT;
          ly_log(trg_ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                 ,0x810);
          goto LAB_0012499e;
        }
        goto LAB_00124511;
      }
      sStack_60 = 0x60;
    }
    parent_00 = (lyd_node_opaq *)calloc(1,sStack_60);
    if (parent_00 == (lyd_node_opaq *)0x0) {
      pcVar12 = "lyd_dup_r";
      parent_00 = (lyd_node_opaq *)0x0;
LAB_0012461d:
      LVar9 = LY_EMEM;
      ly_log(trg_ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar12);
      goto LAB_0012499e;
    }
  }
  uVar8 = uVar4 & 9 | 4;
  if ((options & 8) != 0) {
    uVar8 = uVar4;
  }
  (parent_00->field_0).node.flags = uVar8;
  if ((options & 0x20) != 0) {
    (parent_00->field_0).node.priv = node->priv;
  }
  if (plVar14 == (lysc_node *)0x0) {
    plVar10 = (lys_module *)&node[2].schema;
  }
  else {
    plVar10 = plVar14->module;
  }
  trg_schema = &(parent_00->field_0).node.schema;
  if (trg_ctx == plVar10->ctx) {
    *trg_schema = plVar14;
  }
  else {
    LVar9 = lyd_find_schema_ctx(plVar14,trg_ctx,parent,'\x01',trg_schema);
    if (LVar9 != LY_SUCCESS) {
      free(parent_00);
      parent_00 = (lyd_node_opaq *)0x0;
      goto LAB_0012499e;
    }
  }
  (parent_00->field_0).node.prev = (lyd_node *)parent_00;
  if ((options & 2) == 0) {
    if (node->schema != (lysc_node *)0x0) {
      pplVar15 = &node->meta;
      do {
        meta = *pplVar15;
        if (meta == (lyd_meta *)0x0) goto LAB_00124771;
        LVar9 = lyd_dup_meta_single_to_ctx(trg_ctx,meta,(lyd_node *)parent_00,(lyd_meta **)0x0);
        pplVar15 = &meta->next;
      } while (LVar9 == LY_SUCCESS);
      goto LAB_0012499e;
    }
    pplVar1 = &parent_00->ctx;
    plVar16 = node + 2;
    while (lVar6 = *(long *)plVar16, lVar6 != 0) {
      if ((parent_00->field_0).node.schema != (lysc_node *)0x0) {
        LVar9 = LY_EINVAL;
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","!node->schema",
               "lyd_dup_attr_single");
        goto LAB_0012499e;
      }
      attr = (lyd_attr *)calloc(1,0x40);
      if (attr == (lyd_attr *)0x0) {
        pcVar12 = "lyd_dup_attr_single";
        trg_ctx = *pplVar1;
        goto LAB_0012461d;
      }
      LVar9 = lydict_insert(*pplVar1,*(char **)(lVar6 + 0x10),0,&(attr->name).name);
      if (LVar9 == LY_SUCCESS) {
        plVar14 = (parent_00->field_0).node.schema;
        plVar10 = (lys_module *)pplVar1;
        if (plVar14 != (lysc_node *)0x0) {
          plVar10 = plVar14->module;
        }
        LVar9 = lydict_insert(plVar10->ctx,*(char **)(lVar6 + 0x18),0,&(attr->name).prefix);
        if (LVar9 != LY_SUCCESS) goto LAB_001246ed;
        plVar14 = (parent_00->field_0).node.schema;
        plVar10 = (lys_module *)pplVar1;
        if (plVar14 != (lysc_node *)0x0) {
          plVar10 = plVar14->module;
        }
        LVar9 = lydict_insert(plVar10->ctx,*(char **)(lVar6 + 0x20),0,
                              &(attr->name).field_2.module_ns);
        if (LVar9 != LY_SUCCESS) goto LAB_001246ed;
        plVar14 = (parent_00->field_0).node.schema;
        plVar10 = (lys_module *)pplVar1;
        if (plVar14 != (lysc_node *)0x0) {
          plVar10 = plVar14->module;
        }
        LVar9 = lydict_insert(plVar10->ctx,*(char **)(lVar6 + 0x28),0,&attr->value);
        if (LVar9 != LY_SUCCESS) goto LAB_001246ed;
        attr->hints = *(uint32_t *)(lVar6 + 0x30);
        LVar5 = *(LY_VALUE_FORMAT *)(lVar6 + 0x34);
        attr->format = LVar5;
        if (*(void **)(lVar6 + 0x38) != (void *)0x0) {
          plVar14 = (parent_00->field_0).node.schema;
          plVar10 = (lys_module *)pplVar1;
          if (plVar14 != (lysc_node *)0x0) {
            plVar10 = plVar14->module;
          }
          LVar9 = ly_dup_prefix_data(plVar10->ctx,LVar5,*(void **)(lVar6 + 0x38),
                                     &attr->val_prefix_data);
          if (LVar9 != LY_SUCCESS) goto LAB_001246ed;
        }
        attr->parent = parent_00;
        plVar7 = parent_00->attr;
        if (parent_00->attr == (lyd_attr *)0x0) {
          parent_00->attr = attr;
        }
        else {
          do {
            plVar11 = plVar7;
            plVar7 = plVar11->next;
          } while (plVar7 != (lyd_attr *)0x0);
          plVar11->next = attr;
        }
      }
      else {
LAB_001246ed:
        plVar14 = (parent_00->field_0).node.schema;
        plVar10 = (lys_module *)pplVar1;
        if (plVar14 != (lysc_node *)0x0) {
          plVar10 = plVar14->module;
        }
        lyd_free_attr_single(plVar10->ctx,attr);
      }
      plVar16 = (lyd_node *)(lVar6 + 8);
    }
  }
LAB_00124771:
  plVar14 = (parent_00->field_0).node.schema;
  if (plVar14 == (lysc_node *)0x0) {
    if ((options & 1) != 0) {
      plVar16 = node + 1;
      do {
        plVar16 = *(lyd_node **)plVar16;
        if (plVar16 == (lyd_node *)0x0) goto LAB_001247ad;
        LVar9 = lyd_dup_r(plVar16,trg_ctx,(lyd_node *)parent_00,1,(lyd_node **)0x0,options,
                          (lyd_node **)0x0);
        plVar16 = (lyd_node *)&plVar16->next;
      } while (LVar9 == LY_SUCCESS);
      goto LAB_0012499e;
    }
LAB_001247ad:
    LVar9 = lydict_insert(trg_ctx,(char *)node[1].schema,0,&(parent_00->name).name);
    if (((LVar9 != LY_SUCCESS) ||
        (LVar9 = lydict_insert(trg_ctx,(char *)node[1].parent,0,&(parent_00->name).prefix),
        LVar9 != LY_SUCCESS)) ||
       ((LVar9 = lydict_insert(trg_ctx,(char *)node[1].next,0,&(parent_00->name).field_2.module_ns),
        LVar9 != LY_SUCCESS ||
        (LVar9 = lydict_insert(trg_ctx,(char *)node[1].prev,0,&parent_00->value),
        LVar9 != LY_SUCCESS)))) goto LAB_0012499e;
    parent_00->hints = *(uint32_t *)&node[1].meta;
    LVar5 = *(LY_VALUE_FORMAT *)((long)&node[1].meta + 4);
    parent_00->format = LVar5;
    if (node[1].priv == (void *)0x0) goto LAB_00124acb;
    LVar9 = ly_dup_prefix_data(trg_ctx,LVar5,node[1].priv,&parent_00->val_prefix_data);
  }
  else {
    uVar3 = plVar14->nodetype;
    if ((uVar3 & 0xc) == 0) {
      if ((uVar3 & 0x711) != 0) {
        if ((options & 1) == 0) {
          if ((uVar3 != 0x10) || ((plVar14->flags & 0x200) != 0)) {
LAB_00124ac3:
            lyd_hash((lyd_node *)parent_00);
            goto LAB_00124acb;
          }
          plVar16 = node + 1;
          do {
            plVar16 = *(lyd_node **)plVar16;
            if ((((plVar16 == (lyd_node *)0x0) ||
                 (plVar14 = plVar16->schema, plVar14 == (lysc_node *)0x0)) ||
                (plVar14->nodetype != 4)) || ((plVar14->flags & 0x100) == 0)) goto LAB_00124ac3;
            LVar9 = lyd_dup_r(plVar16,trg_ctx,(lyd_node *)parent_00,1,(lyd_node **)0x0,options,
                              (lyd_node **)0x0);
            plVar16 = (lyd_node *)&plVar16->next;
          } while (LVar9 == LY_SUCCESS);
        }
        else {
          if (node[1].schema != (lysc_node *)0x0) {
            plVar13 = lyht_new(*(uint32_t *)(node[1].schema)->hash,8,lyd_hash_table_val_equal,
                               (void *)0x0,1);
            (parent_00->name).name = (char *)plVar13;
          }
          plVar16 = node + 1;
          do {
            plVar16 = *(lyd_node **)plVar16;
            if (plVar16 == (lyd_node *)0x0) goto LAB_00124ac3;
            LVar9 = lyd_dup_r(plVar16,trg_ctx,(lyd_node *)parent_00,1,(lyd_node **)0x0,options,
                              (lyd_node **)0x0);
            plVar16 = (lyd_node *)&plVar16->next;
          } while (LVar9 == LY_SUCCESS);
        }
        goto LAB_0012499e;
      }
      if ((uVar3 & 0x60) == 0) goto LAB_00124acb;
      (parent_00->field_0).node.hash = node->hash;
      LVar9 = lyd_any_copy_value((lyd_node *)parent_00,(lyd_any_value *)(node + 1),
                                 *(LYD_ANYDATA_VALUETYPE *)&node[1].schema);
    }
    else {
      (parent_00->field_0).node.hash = node->hash;
      if (node->schema == (lysc_node *)0x0) {
        plVar10 = (lys_module *)&node[2].schema;
      }
      else {
        plVar10 = node->schema->module;
      }
      if (trg_ctx == plVar10->ctx) {
        LVar9 = (*(code *)(node[1].schema)->parent->dsc)(trg_ctx,node + 1,&parent_00->child);
        if (LVar9 == LY_SUCCESS) goto LAB_00124acb;
        ly_log(trg_ctx,LY_LLERR,LVar9,"Value duplication failed.");
        goto LAB_0012499e;
      }
      pcVar12 = lyd_get_value(node);
      plVar14 = (parent_00->field_0).node.schema;
      type = plVar14[1].parent;
      value_len = strlen(pcVar12);
      LVar9 = lyd_value_store(trg_ctx,(lyd_value *)&parent_00->child,(lysc_type *)type,pcVar12,
                              value_len,'\x01','\x01',(ly_bool *)0x0,LY_VALUE_CANON,(void *)0x0,
                              0x3f3,plVar14,(ly_bool *)0x0);
    }
  }
  if (LVar9 == LY_SUCCESS) {
LAB_00124acb:
    lyd_insert_node(parent,first,(lyd_node *)parent_00,insert_order);
    if (dup_p == (lyd_node **)0x0) {
      return LY_SUCCESS;
    }
    *dup_p = (lyd_node *)parent_00;
    return LY_SUCCESS;
  }
LAB_0012499e:
  lyd_free_tree((lyd_node *)parent_00);
  return LVar9;
}

Assistant:

static LY_ERR
lyd_dup_r(const struct lyd_node *node, const struct ly_ctx *trg_ctx, struct lyd_node *parent, uint32_t insert_order,
        struct lyd_node **first, uint32_t options, struct lyd_node **dup_p)
{
    LY_ERR ret;
    struct lyd_node *dup = NULL;
    struct lyd_meta *meta;
    struct lyd_attr *attr;
    struct lyd_node_any *any;
    const struct lysc_type *type;
    const char *val_can;

    LY_CHECK_ARG_RET(NULL, node, LY_EINVAL);

    if (node->flags & LYD_EXT) {
        if (options & LYD_DUP_NO_EXT) {
            /* no not duplicate this subtree */
            return LY_SUCCESS;
        }

        /* we need to use the same context */
        trg_ctx = LYD_CTX(node);
    }

    if (!node->schema) {
        dup = calloc(1, sizeof(struct lyd_node_opaq));
        ((struct lyd_node_opaq *)dup)->ctx = trg_ctx;
    } else {
        switch (node->schema->nodetype) {
        case LYS_RPC:
        case LYS_ACTION:
        case LYS_NOTIF:
        case LYS_CONTAINER:
        case LYS_LIST:
            dup = calloc(1, sizeof(struct lyd_node_inner));
            break;
        case LYS_LEAF:
        case LYS_LEAFLIST:
            dup = calloc(1, sizeof(struct lyd_node_term));
            break;
        case LYS_ANYDATA:
        case LYS_ANYXML:
            dup = calloc(1, sizeof(struct lyd_node_any));
            break;
        default:
            LOGINT(trg_ctx);
            ret = LY_EINT;
            goto error;
        }
    }
    LY_CHECK_ERR_GOTO(!dup, LOGMEM(trg_ctx); ret = LY_EMEM, error);

    if (options & LYD_DUP_WITH_FLAGS) {
        dup->flags = node->flags;
    } else {
        dup->flags = (node->flags & (LYD_DEFAULT | LYD_EXT)) | LYD_NEW;
    }
    if (options & LYD_DUP_WITH_PRIV) {
        dup->priv = node->priv;
    }
    if (trg_ctx == LYD_CTX(node)) {
        dup->schema = node->schema;
    } else {
        ret = lyd_find_schema_ctx(node->schema, trg_ctx, parent, 1, &dup->schema);
        if (ret) {
            /* has no schema but is not an opaque node */
            free(dup);
            dup = NULL;
            goto error;
        }
    }
    dup->prev = dup;

    /* duplicate metadata/attributes */
    if (!(options & LYD_DUP_NO_META)) {
        if (!node->schema) {
            LY_LIST_FOR(((struct lyd_node_opaq *)node)->attr, attr) {
                LY_CHECK_GOTO(ret = lyd_dup_attr_single(attr, dup, NULL), error);
            }
        } else {
            LY_LIST_FOR(node->meta, meta) {
                LY_CHECK_GOTO(ret = lyd_dup_meta_single_to_ctx(trg_ctx, meta, dup, NULL), error);
            }
        }
    }

    /* nodetype-specific work */
    if (!dup->schema) {
        struct lyd_node_opaq *opaq = (struct lyd_node_opaq *)dup;
        struct lyd_node_opaq *orig = (struct lyd_node_opaq *)node;
        struct lyd_node *child;

        if (options & LYD_DUP_RECURSIVE) {
            /* duplicate all the children */
            LY_LIST_FOR(orig->child, child) {
                LY_CHECK_GOTO(ret = lyd_dup_r(child, trg_ctx, dup, LYD_INSERT_NODE_LAST, NULL, options, NULL), error);
            }
        }
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->name.name, 0, &opaq->name.name), error);
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->name.prefix, 0, &opaq->name.prefix), error);
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->name.module_ns, 0, &opaq->name.module_ns), error);
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->value, 0, &opaq->value), error);
        opaq->hints = orig->hints;
        opaq->format = orig->format;
        if (orig->val_prefix_data) {
            ret = ly_dup_prefix_data(trg_ctx, opaq->format, orig->val_prefix_data, &opaq->val_prefix_data);
            LY_CHECK_GOTO(ret, error);
        }
    } else if (dup->schema->nodetype & LYD_NODE_TERM) {
        struct lyd_node_term *term = (struct lyd_node_term *)dup;
        struct lyd_node_term *orig = (struct lyd_node_term *)node;

        term->hash = orig->hash;
        if (trg_ctx == LYD_CTX(node)) {
            ret = orig->value.realtype->plugin->duplicate(trg_ctx, &orig->value, &term->value);
            LY_CHECK_ERR_GOTO(ret, LOGERR(trg_ctx, ret, "Value duplication failed."), error);
        } else {
            /* store canonical value in the target context */
            val_can = lyd_get_value(node);
            type = ((struct lysc_node_leaf *)term->schema)->type;
            ret = lyd_value_store(trg_ctx, &term->value, type, val_can, strlen(val_can), 1, 1, NULL, LY_VALUE_CANON, NULL,
                    LYD_HINT_DATA, term->schema, NULL);
            LY_CHECK_GOTO(ret, error);
        }
    } else if (dup->schema->nodetype & LYD_NODE_INNER) {
        struct lyd_node_inner *orig = (struct lyd_node_inner *)node;
        struct lyd_node *child;

        if (options & LYD_DUP_RECURSIVE) {
            /* create a hash table with the size of the previous hash table (duplicate) */
            if (orig->children_ht) {
                ((struct lyd_node_inner *)dup)->children_ht = lyht_new(orig->children_ht->size, sizeof(struct lyd_node *), lyd_hash_table_val_equal, NULL, 1);
            }

            /* duplicate all the children */
            LY_LIST_FOR(orig->child, child) {
                LY_CHECK_GOTO(ret = lyd_dup_r(child, trg_ctx, dup, LYD_INSERT_NODE_LAST, NULL, options, NULL), error);
            }
        } else if ((dup->schema->nodetype == LYS_LIST) && !(dup->schema->flags & LYS_KEYLESS)) {
            /* always duplicate keys of a list */
            for (child = orig->child; child && lysc_is_key(child->schema); child = child->next) {
                LY_CHECK_GOTO(ret = lyd_dup_r(child, trg_ctx, dup, LYD_INSERT_NODE_LAST, NULL, options, NULL), error);
            }
        }
        lyd_hash(dup);
    } else if (dup->schema->nodetype & LYD_NODE_ANY) {
        dup->hash = node->hash;
        any = (struct lyd_node_any *)node;
        LY_CHECK_GOTO(ret = lyd_any_copy_value(dup, &any->value, any->value_type), error);
    }

    /* insert */
    lyd_insert_node(parent, first, dup, insert_order);

    if (dup_p) {
        *dup_p = dup;
    }
    return LY_SUCCESS;

error:
    lyd_free_tree(dup);
    return ret;
}